

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMousePosAndButtons(void)

{
  int iVar1;
  bool local_41;
  ImVec2 local_40;
  double local_38;
  double mouse_y;
  double mouse_x;
  bool focused;
  ImVec2 local_1c;
  ImVec2 mouse_pos_backup;
  int i;
  ImGuiIO *io;
  
  register0x00000000 = ImGui::GetIO();
  for (mouse_pos_backup.x = 0.0; (int)mouse_pos_backup.x < 5;
      mouse_pos_backup.x = (float)((int)mouse_pos_backup.x + 1)) {
    local_41 = true;
    if ((g_MouseJustPressed[(int)mouse_pos_backup.x] & 1U) == 0) {
      iVar1 = glfwGetMouseButton(g_Window,(int)mouse_pos_backup.x);
      local_41 = iVar1 != 0;
    }
    stack0xfffffffffffffff0->MouseDown[(int)mouse_pos_backup.x] = local_41;
    g_MouseJustPressed[(int)mouse_pos_backup.x] = false;
  }
  local_1c = stack0xfffffffffffffff0->MousePos;
  ImVec2::ImVec2((ImVec2 *)((long)&mouse_x + 4),-3.4028235e+38,-3.4028235e+38);
  stack0xfffffffffffffff0->MousePos = stack0xffffffffffffffdc;
  iVar1 = glfwGetWindowAttrib(g_Window,0x20001);
  mouse_x._3_1_ = iVar1 != 0;
  if ((bool)mouse_x._3_1_) {
    if ((stack0xfffffffffffffff0->WantSetMousePos & 1U) == 0) {
      glfwGetCursorPos(g_Window,&mouse_y,&local_38);
      ImVec2::ImVec2(&local_40,(float)mouse_y,(float)local_38);
      stack0xfffffffffffffff0->MousePos = local_40;
    }
    else {
      glfwSetCursorPos(g_Window,(double)local_1c.x,(double)local_1c.y);
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMousePosAndButtons()
{
    // Update buttons
    ImGuiIO& io = ImGui::GetIO();
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        // If a mouse press event came, always pass it as "mouse held this frame", so we don't miss click-release events that are shorter than 1 frame.
        io.MouseDown[i] = g_MouseJustPressed[i] || glfwGetMouseButton(g_Window, i) != 0;
        g_MouseJustPressed[i] = false;
    }

    // Update mouse position
    const ImVec2 mouse_pos_backup = io.MousePos;
    io.MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
#ifdef __EMSCRIPTEN__
    const bool focused = true; // Emscripten
#else
    const bool focused = glfwGetWindowAttrib(g_Window, GLFW_FOCUSED) != 0;
#endif
    if (focused)
    {
        if (io.WantSetMousePos)
        {
            glfwSetCursorPos(g_Window, (double)mouse_pos_backup.x, (double)mouse_pos_backup.y);
        }
        else
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(g_Window, &mouse_x, &mouse_y);
            io.MousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
}